

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_9::DiskHandle::write(DiskHandle *this,int __fd,void *__buf,size_t __n)

{
  int osErrorNumber;
  ssize_t in_RAX;
  undefined4 in_register_00000034;
  long __offset;
  ssize_t n;
  Fault f_1;
  Fault f;
  
  __offset = CONCAT44(in_register_00000034,__fd);
  do {
    if (__n == 0) {
      return in_RAX;
    }
    do {
      n = pwrite64((this->fd).fd,__buf,__n,__offset);
      if (-1 < n) goto LAB_003bd914;
      osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
    } while (osErrorNumber == -1);
    if (osErrorNumber != 0) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x186,osErrorNumber,"n = pwrite(fd, data.begin(), data.size(), offset)","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_003bd914:
    if (n < 1) {
      f.exception = (Exception *)&n;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x187,FAILED,"n > 0","_kjCondition,\"pwrite() returned zero?\"",
                 (DebugComparison<long_&,_int> *)&f,(char (*) [24])"pwrite() returned zero?");
      kj::_::Debug::Fault::fatal(&f_1);
    }
    __offset = __offset + n;
    __buf = (void *)((long)__buf + n);
    __n = __n - n;
    in_RAX = n;
    f.exception = (Exception *)&n;
  } while( true );
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const {
    // pwrite() probably never returns short writes unless there's no space left on disk.
    // Unfortunately, though, per spec we are not allowed to assume this.

    while (data.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pwrite(fd, data.begin(), data.size(), offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");
      offset += n;
      data = data.slice(n, data.size());
    }
  }